

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

Ref<embree::SceneGraph::MaterialNode> __thiscall
embree::XMLLoader::loadBGFMaterial(XMLLoader *this,Ref<embree::XML> *xml)

{
  _Base_ptr *pp_Var1;
  XML *pXVar2;
  Ref<embree::XML> *in_RDX;
  Parms parms;
  string type;
  string name;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>_>_>
  local_98;
  undefined1 local_68 [64];
  
  pXVar2 = in_RDX->ptr;
  pp_Var1 = &local_98._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_98._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"type","");
  XML::parm((string *)local_68,pXVar2,(string *)&local_98);
  if ((_Base_ptr *)local_98._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)local_98._M_impl._0_8_);
  }
  pXVar2 = in_RDX->ptr;
  local_98._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"name","");
  XML::parm((string *)(local_68 + 0x20),pXVar2,(string *)&local_98);
  if ((_Base_ptr *)local_98._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)local_98._M_impl._0_8_);
  }
  loadMaterialParms((Parms *)&local_98,(XMLLoader *)xml,in_RDX);
  addMaterial(this,(string *)xml,(Parms *)local_68);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Variant>_>_>
  ::~_Rb_tree(&local_98);
  if ((_Base_ptr)local_68._32_8_ != (_Base_ptr)(local_68 + 0x30)) {
    operator_delete((void *)local_68._32_8_);
  }
  if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
    operator_delete((void *)local_68._0_8_);
  }
  return (Ref<embree::SceneGraph::MaterialNode>)(MaterialNode *)this;
}

Assistant:

Ref<SceneGraph::MaterialNode> XMLLoader::loadBGFMaterial(const Ref<XML>& xml) 
  {
    std::string type = xml->parm("type");
    std::string name = xml->parm("name");
    Parms parms = loadMaterialParms(xml);
    return addMaterial(type,parms);
  }